

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     AssignmentOperatorHelper<true,_int,_float,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute<false>(View<int,_false,_std::allocator<unsigned_long>_> *from,
                     View<float,_true,_std::allocator<unsigned_long>_> *to)

{
  to->data_ = (pointer)from->data_;
  Geometry<std::allocator<unsigned_long>_>::operator=(&to->geometry_,&from->geometry_);
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, isConstFrom, AFrom>& from,
        View<TTo, true, ATo>& to
    )
    {
        Assert(MARRAY_NO_ARG_TEST || sizeof(TFrom) == sizeof(TTo));
        to.data_ = static_cast<const TTo*>(
            static_cast<const void*>(from.data_)); // copy pointer
        to.geometry_ = from.geometry_;
    }